

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O2

optional<google::protobuf::internal::DescriptorNames> __thiscall
google::protobuf::anon_unknown_24::
FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
::CreateDescriptorNames
          (FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
           *this,initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> bytes,
          initializer_list<unsigned_long> sizes)

{
  ulong *puVar1;
  PointerT<char> pcVar2;
  size_t __n;
  int v1;
  long lVar3;
  Nullable<const_char_*> failure_msg;
  long lVar4;
  int iVar5;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 uVar6;
  long lVar7;
  iterator pbVar8;
  _Storage<google::protobuf::internal::DescriptorNames,_true> unaff_R12;
  long lVar9;
  const_iterator __begin3;
  optional<google::protobuf::internal::DescriptorNames> oVar10;
  LogMessageFatal local_40;
  
  pbVar8 = bytes._M_array;
  lVar7 = sizes._M_len * 8;
  lVar3 = 0;
  do {
    if (lVar7 - lVar3 == 0) {
      lVar9 = bytes._M_len << 4;
      lVar3 = 0;
      for (lVar4 = 0; lVar9 != lVar4; lVar4 = lVar4 + 0x10) {
        lVar3 = lVar3 + *(long *)((long)&pbVar8->_M_len + lVar4);
      }
      pcVar2 = (this->pointers_).payload_.super_Base<char>.value;
      if (pcVar2 == (PointerT<char>)0x0) {
        failure_msg = "has_allocated()";
        iVar5 = 0x1b0;
LAB_00c09488:
        absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                  (&local_40,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.cc"
                   ,iVar5,failure_msg);
        absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal(&local_40);
      }
      iVar5 = (this->used_).payload_.super_Base<char>.value;
      v1 = ((int)lVar3 + (int)sizes._M_len * 2 + 7U & 0xfffffff8) + iVar5;
      (this->used_).payload_.super_Base<char>.value = v1;
      failure_msg = absl::lts_20250127::log_internal::Check_LEImpl
                              (v1,(this->total_).payload_.super_Base<char>.value,
                               "used <= total_.template Get<TypeToUse>()");
      if (failure_msg != (Nullable<const_char_*>)0x0) {
        iVar5 = 0x1b6;
        goto LAB_00c09488;
      }
      unaff_R12 = (_Storage<google::protobuf::internal::DescriptorNames,_true>)
                  ((long)pcVar2 + (long)iVar5);
      uVar6 = extraout_RDX;
      for (; lVar9 != 0; lVar9 = lVar9 + -0x10) {
        __n = pbVar8->_M_len;
        memcpy((void *)unaff_R12,pbVar8->_M_str,__n);
        unaff_R12 = (_Storage<google::protobuf::internal::DescriptorNames,_true>)
                    ((long)unaff_R12 + __n);
        pbVar8 = pbVar8 + 1;
        uVar6 = extraout_RDX_00;
      }
      lVar3 = 0;
      for (; lVar7 != 0; lVar7 = lVar7 + -8) {
        *(undefined2 *)((long)unaff_R12 + lVar3) = *(undefined2 *)((long)sizes._M_array + lVar3 * 4)
        ;
        lVar3 = lVar3 + 2;
      }
      uVar6 = CONCAT71((int7)((ulong)uVar6 >> 8),1);
      goto LAB_00c0945b;
    }
    puVar1 = (ulong *)((long)sizes._M_array + lVar3);
    lVar3 = lVar3 + 8;
  } while (*puVar1 < 0x10000);
  uVar6 = 0;
LAB_00c0945b:
  oVar10.super__Optional_base<google::protobuf::internal::DescriptorNames,_true,_true>._M_payload.
  super__Optional_payload_base<google::protobuf::internal::DescriptorNames>._8_8_ = uVar6;
  oVar10.super__Optional_base<google::protobuf::internal::DescriptorNames,_true,_true>._M_payload.
  super__Optional_payload_base<google::protobuf::internal::DescriptorNames>._M_payload = unaff_R12;
  return (optional<google::protobuf::internal::DescriptorNames>)
         oVar10.super__Optional_base<google::protobuf::internal::DescriptorNames,_true,_true>.
         _M_payload.super__Optional_payload_base<google::protobuf::internal::DescriptorNames>;
}

Assistant:

std::optional<internal::DescriptorNames> CreateDescriptorNames(
      std::initializer_list<absl::string_view> bytes,
      std::initializer_list<size_t> sizes) {
    for (size_t size : sizes) {
      // Name too long.
      if (size != static_cast<uint16_t>(size)) {
        return std::nullopt;
      }
    }

    size_t total_size = 0;
    for (auto b : bytes) total_size += b.size();
    total_size += sizes.size() * sizeof(uint16_t);
    char* out = AllocateArray<char>(total_size);
    for (absl::string_view b : bytes) {
      memcpy(out, b.data(), b.size());
      out += b.size();
    }
    auto res = internal::DescriptorNames(out);
    for (size_t size : sizes) {
      uint16_t size16 = static_cast<uint16_t>(size);
      memcpy(out, &size16, sizeof(size16));
      out += sizeof(size16);
    }
    return res;
  }